

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidget::render(QWidget *this,QPainter *painter,QPoint *targetOffset,QRegion *sourceRegion,
               RenderFlags renderFlags)

{
  undefined1 *puVar1;
  QWidgetPrivate *this_00;
  QPaintEnginePrivate *this_01;
  char cVar2;
  int iVar3;
  QWExtra *pQVar4;
  long lVar5;
  QPaintDevice *target;
  QPainter *painter_00;
  QPaintEnginePrivate *pQVar6;
  char *pcVar7;
  QTransform *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  ulong uVar10;
  double dVar11;
  byte local_e8;
  QRegion local_b8;
  QRegion painterClip;
  QRegion oldSystemViewport;
  QRegion oldBaseClip;
  QRegion oldSystemClip;
  QRegion toBePainted;
  QTransform local_88;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (painter == (QPainter *)0x0) {
    pcVar7 = "QWidget::render: Null pointer to painter";
  }
  else {
    cVar2 = QPainter::isActive();
    if (cVar2 != '\0') {
      dVar11 = (double)QPainter::opacity();
      uVar10 = -(ulong)(dVar11 < -dVar11);
      if (1e-12 < (double)(~uVar10 & (ulong)dVar11 | (ulong)-dVar11 & uVar10)) {
        this_00 = *(QWidgetPrivate **)&this->field_0x8;
        pQVar4 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                 ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if ((pQVar4 == (QWExtra *)0x0) ||
           (toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa,
           (*(ushort *)&pQVar4->field_0x7c & 0x40) == 0)) {
          toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QWidgetPrivate::prepareToRender
                    ((QWidgetPrivate *)&toBePainted,(QRegion *)this_00,
                     (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(sourceRegion,0));
          local_e8 = 0;
        }
        else {
          QRegion::QRegion(&toBePainted,sourceRegion);
          local_e8 = 1;
        }
        cVar2 = QRegion::isEmpty();
        if (cVar2 == '\0') {
          pQVar4 = (this_00->extra)._M_t.
                   super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                   super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                   super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
          if (pQVar4 == (QWExtra *)0x0) {
            QWidgetPrivate::createExtra(this_00);
            pQVar4 = (this_00->extra)._M_t.
                     super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
          }
          pQVar4->field_0x7c = pQVar4->field_0x7c | 0x40;
          lVar5 = QPainter::paintEngine();
          this_01 = *(QPaintEnginePrivate **)(lVar5 + 0x18);
          target = (QPaintDevice *)QPaintEngine::paintDevice();
          if ((local_e8 != 0) ||
             ((1.0 <= dVar11 && (iVar3 = (**(code **)(*(long *)target + 0x10))(), iVar3 != 4)))) {
            painter_00 = QWidgetPrivate::sharedPainter(this_00);
            QWidgetPrivate::setSharedPainter(this_00,painter);
            pQVar6 = this_01 + 0x40;
            pQVar8 = &local_88;
            for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
              pQVar8->m_matrix[0][0] = *(qreal *)pQVar6;
              pQVar6 = pQVar6 + (ulong)bVar9 * -0x10 + 8;
              pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
            }
            oldSystemClip.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&oldSystemClip,(QRegion *)(this_01 + 0x20));
            oldBaseClip.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&oldBaseClip,(QRegion *)(this_01 + 0x18));
            oldSystemViewport.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&oldSystemViewport,(QRegion *)(this_01 + 0x38));
            QPainter::layoutDirection();
            cVar2 = QPainter::hasClipping();
            if (cVar2 == '\0') {
              QPaintEnginePrivate::setSystemViewport(this_01,&oldSystemClip);
            }
            else {
              painterClip.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QPainter::deviceTransform();
              QPainter::clipRegion();
              QTransform::map(&painterClip);
              QRegion::~QRegion(&local_b8);
              cVar2 = QRegion::isEmpty();
              if (cVar2 == '\0') {
                QRegion::operator&(&local_b8,&oldSystemClip);
              }
              else {
                QRegion::QRegion(&local_b8,&painterClip);
              }
              QPaintEnginePrivate::setSystemViewport(this_01,&local_b8);
              QRegion::~QRegion(&local_b8);
              QRegion::~QRegion(&painterClip);
            }
            QPainter::setLayoutDirection((LayoutDirection)painter);
            QWidgetPrivate::render(this_00,target,targetOffset,&toBePainted,renderFlags);
            QRegion::operator=((QRegion *)(this_01 + 0x18),&oldBaseClip);
            QPaintEnginePrivate::setSystemTransformAndViewport(this_01,&local_88,&oldSystemViewport)
            ;
            (**(code **)(*(long *)this_01 + 0x10))(this_01);
            QPainter::setLayoutDirection((LayoutDirection)painter);
            QWidgetPrivate::setSharedPainter(this_00,painter_00);
            pQVar4 = (this_00->extra)._M_t.
                     super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
            *(ushort *)&pQVar4->field_0x7c =
                 (ushort)*(undefined4 *)&pQVar4->field_0x7c & 0xffbf | (ushort)local_e8 << 6;
            QRegion::~QRegion(&oldSystemViewport);
            QRegion::~QRegion(&oldBaseClip);
            QRegion::~QRegion(&oldSystemClip);
          }
          else {
            QWidgetPrivate::render_helper(this_00,painter,targetOffset,&toBePainted,renderFlags);
            puVar1 = &((this_00->extra)._M_t.
                       super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                       super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
            *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffbf;
          }
        }
        QRegion::~QRegion(&toBePainted);
      }
      goto LAB_002f824b;
    }
    pcVar7 = "QWidget::render: Cannot render with an inactive painter";
  }
  local_88.m_matrix[1][0] = 3.05543930413181e-317;
  local_88.m_matrix[0][2]._4_4_ = 0;
  local_88.m_matrix[0]._12_8_ = 0;
  local_88.m_matrix[0]._4_8_ = 0;
  local_88.m_matrix[0][0]._0_4_ = 2;
  QMessageLogger::warning((char *)&local_88,pcVar7);
LAB_002f824b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::render(QPainter *painter, const QPoint &targetOffset,
                     const QRegion &sourceRegion, RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!painter)) {
        qWarning("QWidget::render: Null pointer to painter");
        return;
    }

    if (Q_UNLIKELY(!painter->isActive())) {
        qWarning("QWidget::render: Cannot render with an inactive painter");
        return;
    }

    const qreal opacity = painter->opacity();
    if (qFuzzyIsNull(opacity))
        return; // Fully transparent.

    Q_D(QWidget);
    const bool inRenderWithPainter = d->extra && d->extra->inRenderWithPainter;
    const QRegion toBePainted = !inRenderWithPainter ? d->prepareToRender(sourceRegion, renderFlags)
                                                     : sourceRegion;
    if (toBePainted.isEmpty())
        return;

    if (!d->extra)
        d->createExtra();
    d->extra->inRenderWithPainter = true;

    QPaintEngine *engine = painter->paintEngine();
    Q_ASSERT(engine);
    QPaintEnginePrivate *enginePriv = engine->d_func();
    Q_ASSERT(enginePriv);
    QPaintDevice *target = engine->paintDevice();
    Q_ASSERT(target);

    // Render via a pixmap when dealing with non-opaque painters or printers.
    if (!inRenderWithPainter && (opacity < 1.0 || (target->devType() == QInternal::Printer))) {
        d->render_helper(painter, targetOffset, toBePainted, renderFlags);
        d->extra->inRenderWithPainter = inRenderWithPainter;
        return;
    }

    // Set new shared painter.
    QPainter *oldPainter = d->sharedPainter();
    d->setSharedPainter(painter);

    // Save current system clip, viewport and transform,
    const QTransform oldTransform = enginePriv->systemTransform;
    const QRegion oldSystemClip = enginePriv->systemClip;
    const QRegion oldBaseClip = enginePriv->baseSystemClip;
    const QRegion oldSystemViewport = enginePriv->systemViewport;
    const Qt::LayoutDirection oldLayoutDirection = painter->layoutDirection();

    // This ensures that all painting triggered by render() is clipped to the current engine clip.
    if (painter->hasClipping()) {
        const QRegion painterClip = painter->deviceTransform().map(painter->clipRegion());
        enginePriv->setSystemViewport(oldSystemClip.isEmpty() ? painterClip : oldSystemClip & painterClip);
    } else {
        enginePriv->setSystemViewport(oldSystemClip);
    }
    painter->setLayoutDirection(layoutDirection());

    d->render(target, targetOffset, toBePainted, renderFlags);

    // Restore system clip, viewport and transform.
    enginePriv->baseSystemClip = oldBaseClip;
    enginePriv->setSystemTransformAndViewport(oldTransform, oldSystemViewport);
    enginePriv->systemStateChanged();
    painter->setLayoutDirection(oldLayoutDirection);

    // Restore shared painter.
    d->setSharedPainter(oldPainter);

    d->extra->inRenderWithPainter = inRenderWithPainter;
}